

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O1

int parse_instruction_token(Context_conflict *ctx,Token token)

{
  char *__src;
  Token TVar1;
  int iVar2;
  int extraout_EAX;
  int iVar3;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  uint uVar4;
  uint uVar5;
  long lVar6;
  Instruction_conflict *pIVar7;
  ulong uVar8;
  uint32 controls;
  char opstr [32];
  uint32 local_5c;
  undefined1 local_58 [40];
  
  TVar1 = token;
  if (token == 0x2b) {
    TVar1 = nexttoken(ctx);
  }
  if (TVar1 != TOKEN_IDENTIFIER) {
    failf(ctx,"%s","Expected instruction");
    return extraout_EAX;
  }
  local_5c = 0;
  __src = ctx->token;
  uVar5 = (uint)ctx->minor_ver;
  if (ctx->minor_ver == 0xff) {
    uVar5 = 0;
  }
  uVar4 = ctx->tokenlen;
  if (((uVar5 | (uint)ctx->major_ver << 0x10) < 0x10004) &&
     (iVar2 = check_token_segment(ctx,"TEX"), iVar2 != 0)) {
    local_5c = 0;
  }
  else {
    iVar2 = check_token_segment(ctx,"TEXLDP");
    if (iVar2 == 0) {
      iVar2 = check_token_segment(ctx,"TEXLDB");
      if (iVar2 == 0) {
        pIVar7 = instructions;
        lVar6 = 0;
        do {
          if ((pIVar7->opcode_string != (char *)0x0) &&
             (iVar2 = check_token_segment(ctx,pIVar7->opcode_string), iVar2 != 0)) {
            if ((ctx->tokenlen == 0) || (*ctx->token == '_')) goto LAB_001239c7;
            ctx->token = __src;
            ctx->tokenlen = uVar4;
          }
          lVar6 = lVar6 + 1;
          pIVar7 = pIVar7 + 1;
        } while (lVar6 != 0x61);
        lVar6 = 0x61;
LAB_001239c7:
        uVar5 = (uint)lVar6;
        if (uVar5 == 0x5e) {
          iVar2 = parse_condition(ctx,&local_5c);
          uVar5 = 0x5e;
          if (iVar2 == 0) {
            failf(ctx,"%s","SETP requires a condition");
          }
        }
        else {
          if (uVar5 == 0x2c) {
            iVar2 = parse_condition(ctx,&local_5c);
            iVar3 = 0x2d;
          }
          else {
            if (uVar5 != 0x28) goto LAB_00123889;
            iVar2 = parse_condition(ctx,&local_5c);
            iVar3 = 0x29;
          }
          uVar5 = iVar3 - (uint)(iVar2 == 0);
        }
        goto LAB_00123889;
      }
      local_5c = 2;
    }
    else {
      local_5c = 1;
    }
  }
  uVar5 = 0x42;
LAB_00123889:
  if ((uVar5 == 0x61) || ((ctx->tokenlen != 0 && (*ctx->token != '_')))) {
    uVar5 = 0x1f;
    if ((int)uVar4 < 0x1f) {
      uVar5 = uVar4;
    }
    memcpy(local_58,__src,(long)(int)uVar5);
    local_58[(int)uVar5] = 0;
    failf(ctx,"Unknown instruction \'%s\'",local_58);
    iVar2 = extraout_EAX_02;
  }
  else {
    ctx->tokenbufpos = 0;
    iVar3 = (*instructions[uVar5].parse_args)(ctx);
    uVar4 = (iVar3 - 1U & 0xf) << 0x18;
    if (ctx->major_ver < 2) {
      uVar4 = 0;
    }
    output_token_noswap(ctx,(uint)(token == 0x2b) << 0x1e | uVar5 & 0xffff |
                            (local_5c & 0xff) << 0x10 | uVar4);
    iVar2 = extraout_EAX_00;
    if (1 < iVar3) {
      uVar8 = 0;
      do {
        output_token_noswap(ctx,ctx->tokenbuf[uVar8]);
        uVar8 = uVar8 + 1;
        iVar2 = extraout_EAX_01;
      } while (iVar3 - 1U != uVar8);
    }
  }
  return iVar2;
}

Assistant:

static int parse_instruction_token(Context *ctx, Token token)
{
    int coissue = 0;
    int predicated = 0;

    if (token == ((Token) '+'))
    {
        coissue = 1;
        token = nexttoken(ctx);
    } // if

    if (token != TOKEN_IDENTIFIER)
    {
        fail(ctx, "Expected instruction");
        return 0;
    } // if

    uint32 controls = 0;
    uint32 opcode = OPCODE_TEXLD;
    const char *origtoken = ctx->token;
    const unsigned int origtokenlen = ctx->tokenlen;

    // "TEX" is only meaningful in ps_1_1.
    if ((!shader_version_atleast(ctx, 1, 4)) && (check_token_segment(ctx, "TEX")))
        controls = 0;

    // This might need to be TEXLD instead of TEXLDP.
    else if (check_token_segment(ctx, "TEXLDP"))
        controls = CONTROL_TEXLDP;

    // This might need to be TEXLD instead of TEXLDB.
    else if (check_token_segment(ctx, "TEXLDB"))
        controls = CONTROL_TEXLDB;

    else  // find the instruction.
    {
        size_t i;
        for (i = 0; i < STATICARRAYLEN(instructions); i++)
        {
            const char *opcode_string = instructions[i].opcode_string;
            if (opcode_string == NULL)
                continue;  // skip this.
            else if (!check_token_segment(ctx, opcode_string))
                continue;  // not us.
            else if ((ctx->tokenlen > 0) && (*ctx->token != '_'))
            {
                ctx->token = origtoken;
                ctx->tokenlen = origtokenlen;
                continue;  // not the match: TEXLD when we wanted TEXLDL, etc.
            } // if

            break;  // found it!
        } // for

        opcode = (uint32) i;

        // This might need to be IFC instead of IF.
        if (opcode == OPCODE_IF)
        {
            if (parse_condition(ctx, &controls))
                opcode = OPCODE_IFC;
        } // if

        // This might need to be BREAKC instead of BREAK.
        else if (opcode == OPCODE_BREAK)
        {
            if (parse_condition(ctx, &controls))
                opcode = OPCODE_BREAKC;
        } // else if

        // SETP has a conditional code, always.
        else if (opcode == OPCODE_SETP)
        {
            if (!parse_condition(ctx, &controls))
                fail(ctx, "SETP requires a condition");
        } // else if
    } // else

    if ( (opcode == STATICARRAYLEN(instructions)) ||
         ((ctx->tokenlen > 0) && (ctx->token[0] != '_')) )
    {
        char opstr[32];
        const int len = Min(sizeof (opstr) - 1, origtokenlen);
        memcpy(opstr, origtoken, len);
        opstr[len] = '\0';
        failf(ctx, "Unknown instruction '%s'", opstr);
        return 0;
    } // if

    const Instruction *instruction = &instructions[opcode];

    // !!! FIXME: predicated instructions

    ctx->tokenbufpos = 0;

    const int tokcount = instruction->parse_args(ctx);

    // insttoks bits are reserved and should be zero if < SM2.
    const uint32 insttoks = shader_version_atleast(ctx, 2, 0) ? tokcount-1 : 0;

    // write out the instruction token.
    output_token(ctx, ((opcode & 0xFFFF) << 0) |
                      ((controls & 0xFF) << 16) |
                      ((insttoks & 0xF) << 24) |
                      ((coissue) ? 0x40000000 : 0x00000000) |
                      ((predicated) ? 0x10000000 : 0x00000000) );

    // write out the argument tokens.
    int i;
    for (i = 0; i < (tokcount-1); i++)
        output_token(ctx, ctx->tokenbuf[i]);

    return 1;
}